

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcLits.c
# Opt level: O0

int Mvc_CoverAnyLiteral(Mvc_Cover_t *pCover,Mvc_Cube_t *pMask)

{
  int local_38;
  int fUseFirst;
  int nLitsCur;
  int i;
  int nBit;
  int nWord;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pMask_local;
  Mvc_Cover_t *pCover_local;
  
  fUseFirst = pCover->nBits;
  do {
    do {
      fUseFirst = fUseFirst + -1;
      if (fUseFirst < 0) {
        return -1;
      }
    } while ((pMask != (Mvc_Cube_t *)0x0) &&
            ((pMask->pData[fUseFirst >> 5] & 1 << ((byte)fUseFirst & 0x1f)) == 0));
    local_38 = 0;
    for (_nBit = (pCover->lCubes).pHead; _nBit != (Mvc_Cube_t *)0x0; _nBit = _nBit->pNext) {
      if (((_nBit->pData[fUseFirst >> 5] & 1 << ((byte)fUseFirst & 0x1f)) != 0) &&
         (local_38 = local_38 + 1, 1 < local_38)) {
        return fUseFirst;
      }
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the any literal that occurs more than once.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Mvc_CoverAnyLiteral( Mvc_Cover_t * pCover, Mvc_Cube_t * pMask )
{
    Mvc_Cube_t * pCube;
    int nWord, nBit, i;
    int nLitsCur;
    int fUseFirst = 0;

    // go through each literal
    if ( fUseFirst )
    {
        for ( i = 0; i < pCover->nBits; i++ )
            if ( !pMask || Mvc_CubeBitValue(pMask,i) )
            {
                // get the word and bit of this literal
                nWord = Mvc_CubeWhichWord(i);
                nBit  = Mvc_CubeWhichBit(i);
                // go through all the cubes
                nLitsCur = 0;
                Mvc_CoverForEachCube( pCover, pCube )
                    if ( pCube->pData[nWord] & (1<<nBit) )
                    {
                        nLitsCur++;
                        if ( nLitsCur > 1 )
                            return i;
                    }
            }
    }
    else
    {
        for ( i = pCover->nBits - 1; i >=0; i-- )
            if ( !pMask || Mvc_CubeBitValue(pMask,i) )
            {
                // get the word and bit of this literal
                nWord = Mvc_CubeWhichWord(i);
                nBit  = Mvc_CubeWhichBit(i);
                // go through all the cubes
                nLitsCur = 0;
                Mvc_CoverForEachCube( pCover, pCube )
                    if ( pCube->pData[nWord] & (1<<nBit) )
                    {
                        nLitsCur++;
                        if ( nLitsCur > 1 )
                            return i;
                    }
            }
    }
    return -1;
}